

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O3

size_t ReadDataFromDisk(FILE *file,char *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if (file == (FILE *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_5c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ReadDataFromDisk","");
    poVar3 = Logger::Start(ERR,&local_38,0xd0,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0xd0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"file",4);
    std::operator<<(poVar3," == NULL \n");
  }
  else {
    if (buf != (char *)0x0) {
      iVar1 = feof((FILE *)file);
      if (iVar1 == 0) {
        sVar2 = fread(buf,1,len,(FILE *)file);
        if (len < sVar2) {
          local_5c.severity_ = FATAL;
          local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,
                     "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                     ,"");
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ReadDataFromDisk","")
          ;
          poVar3 = Logger::Start(FATAL,&local_38,0xd9,&local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Error: invoke fread().",0x16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_38._M_dataplus._M_p != &local_38.field_2) {
            operator_delete(local_38._M_dataplus._M_p);
          }
          Logger::~Logger(&local_5c);
        }
      }
      else {
        sVar2 = 0;
      }
      return sVar2;
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_5c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ReadDataFromDisk","");
    poVar3 = Logger::Start(ERR,&local_38,0xd1,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0xd1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"buf",3);
    std::operator<<(poVar3," == NULL \n");
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

inline size_t ReadDataFromDisk(FILE *file, char *buf, size_t len) {
  CHECK_NOTNULL(file);
  CHECK_NOTNULL(buf);
  CHECK_GE(len, 0);
  // Reach the end of the file
  if (feof(file)) {
    return 0;
  }
  size_t ret = fread(buf, 1, len, file);
  if (ret > len) {
    LOG(FATAL) << "Error: invoke fread().";
  }
  return ret;
}